

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O2

bool __thiscall MipsElfFile::load(MipsElfFile *this,path *fileName,path *outputFileName)

{
  pointer ppEVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_30;
  
  ghc::filesystem::path::operator=(&this->outputFileName,outputFileName);
  bVar2 = ElfFile::load(&this->elf,fileName,true);
  if (bVar2) {
    local_30._M_dataplus._M_p._0_2_ = (this->elf).fileHeader.e_type;
    if ((Elf32_Half)local_30._M_dataplus._M_p == 2) {
      ppEVar1 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppEVar1) {
        (*(this->super_AssemblerFile)._vptr_AssemblerFile[9])
                  (this,(ulong)((*ppEVar1)->header).p_vaddr);
        return true;
      }
      return true;
    }
    if ((Elf32_Half)local_30._M_dataplus._M_p != 0xffa0) {
      Logger::printError<ghc::filesystem::path,unsigned_short>
                (FatalError,"Unknown ELF %s type %d",fileName,(unsigned_short *)&local_30);
      return false;
    }
    ghc::filesystem::path::u8string_abi_cxx11_(&local_30,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1801d8,(char *)&local_30,in_RCX);
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_30,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1801c6,(char *)&local_30,in_RCX);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool MipsElfFile::load(const fs::path& fileName, const fs::path& outputFileName)
{
	this->outputFileName = outputFileName;

	if (!elf.load(fileName,true))
	{
		Logger::printError(Logger::FatalError, "Failed to load %s",fileName.u8string());
		return false;
	}

	if (elf.getType() == 0xFFA0)
	{
		Logger::printError(Logger::FatalError, "Relocatable ELF %s not supported yet",fileName.u8string());
		return false;
	}

	if (elf.getType() != 2)
	{
		Logger::printError(Logger::FatalError, "Unknown ELF %s type %d",fileName,elf.getType());
		return false;
	}

	if (elf.getSegmentCount() != 0)
		seekVirtual(elf.getSegment(0)->getVirtualAddress());

	return true;
}